

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O1

csprng_engine * jbcoin::crypto_prng(void)

{
  int iVar1;
  
  if (crypto_prng()::engine == '\0') {
    iVar1 = __cxa_guard_acquire(&crypto_prng()::engine);
    if (iVar1 != 0) {
      crypto_prng::engine.mutex_.super___mutex_base._M_mutex._16_8_ = 0;
      crypto_prng::engine.mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      crypto_prng::engine.mutex_.super___mutex_base._M_mutex.__align = 0;
      crypto_prng::engine.mutex_.super___mutex_base._M_mutex._8_8_ = 0;
      crypto_prng::engine.mutex_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      csprng_engine::mix_entropy(&crypto_prng::engine,(void *)0x0,0);
      __cxa_guard_release(&crypto_prng()::engine);
    }
  }
  return &crypto_prng::engine;
}

Assistant:

csprng_engine& crypto_prng()
{
    static csprng_engine engine;
    return engine;
}